

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool ON_BinaryArchive::ToggleByteOrder(size_t count,size_t sizeof_element,void *src,void *dst)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  bool bVar11;
  ulong local_78;
  size_t i;
  uchar *b1;
  uchar *b;
  uchar *a;
  uchar c [32];
  bool rc;
  void *dst_local;
  void *src_local;
  size_t sizeof_element_local;
  size_t count_local;
  
  bVar11 = true;
  if ((((count != 0) && (bVar11 = false, count != 0)) && (bVar11 = false, sizeof_element != 0)) &&
     (bVar11 = false, src != (void *)0x0)) {
    bVar11 = dst != (void *)0x0;
  }
  if ((bVar11) && (count != 0)) {
    puVar8 = (uchar *)((long)dst + count * sizeof_element);
    b1 = (uchar *)dst;
    b = (uchar *)src;
    if (sizeof_element == 2) {
      while (b1 < puVar8) {
        puVar9 = b + 1;
        uVar1 = *b;
        b = b + 2;
        puVar10 = b1 + 1;
        *b1 = *puVar9;
        b1 = b1 + 2;
        *puVar10 = uVar1;
      }
    }
    else if (sizeof_element == 4) {
      while (b1 < puVar8) {
        uVar1 = *b;
        uVar2 = b[1];
        puVar9 = b + 3;
        uVar3 = b[2];
        b = b + 4;
        *b1 = *puVar9;
        b1[1] = uVar3;
        puVar9 = b1 + 3;
        b1[2] = uVar2;
        b1 = b1 + 4;
        *puVar9 = uVar1;
      }
    }
    else if (sizeof_element == 8) {
      while (b1 < puVar8) {
        uVar1 = *b;
        uVar2 = b[1];
        uVar3 = b[2];
        uVar4 = b[3];
        uVar5 = b[4];
        uVar6 = b[5];
        puVar9 = b + 7;
        uVar7 = b[6];
        b = b + 8;
        *b1 = *puVar9;
        b1[1] = uVar7;
        b1[2] = uVar6;
        b1[3] = uVar5;
        b1[4] = uVar4;
        b1[5] = uVar3;
        puVar9 = b1 + 7;
        b1[6] = uVar2;
        b1 = b1 + 8;
        *puVar9 = uVar1;
      }
    }
    else if (sizeof_element < 0x20) {
      while (b1 < puVar8) {
        for (local_78 = 0; local_78 < sizeof_element; local_78 = local_78 + 1) {
          c[local_78 - 8] = *b;
          b = b + 1;
        }
        while (local_78 != 0) {
          *b1 = *(uchar *)((long)&b + local_78 + 7);
          local_78 = local_78 - 1;
          b1 = b1 + 1;
        }
      }
    }
    else {
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

bool ON_BinaryArchive::ToggleByteOrder(
  size_t count,          // number of elements
  size_t sizeof_element, // size of element (2,4, or 8)
  const void* src,    // source buffer
  void* dst           // destination buffer (can be same as source buffer)
  )
{
  bool rc = (0 == count || (count > 0 && sizeof_element > 0 && nullptr != src && nullptr != dst));
  if ( rc && count > 0 ) 
  {
    unsigned char c[32];
    const unsigned char* a = (const unsigned char*)src;
    unsigned char* b = (unsigned char*)dst;
    const unsigned char* b1 = b + (count*sizeof_element);

    // loops are unrolled and a switch is used
    // to speed things up a bit.
    switch(sizeof_element) 
    {
    case 2:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 4:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 8:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        c[4] = *a++;
        c[5] = *a++;
        c[6] = *a++;
        c[7] = *a++;
        *b++ = c[7];
        *b++ = c[6];
        *b++ = c[5];
        *b++ = c[4];
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    default:
      if ( sizeof_element < 32 )
      {
        // As of 2 May 2003, this case is never used
        // by core opennurbs objects.
        //
        // This is here so that future code will work
        // if and when 128 bit "ints"/"doubles" become common
        // enough that they can be stored in 3dm files.
        // It may also happen that third party applications
        // on specialized CPUs need to toggle byte order
        // for 128 bit ints/doubles stored as user data.
        size_t i;
        while(b < b1)
        {
          for (i = 0; i < sizeof_element; i++)
            c[i] = *a++;
          while(i--)
            *b++ = c[i];
        }
      }
      else
      {
        rc = false;
      }
      break;
    }
  }
  return rc;
}